

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_types.h
# Opt level: O2

Shape * dukglue::types::DukType<Shape>::read<Shape*,void>(duk_context *ctx,duk_idx_t arg_idx)

{
  duk_int_t line;
  bool bVar1;
  duk_bool_t dVar2;
  TypeInfo *this;
  Shape *pSVar3;
  char *fmt;
  
  dVar2 = duk_is_null(ctx,arg_idx);
  if (dVar2 != 0) {
    return (Shape *)0x0;
  }
  dVar2 = duk_is_object(ctx,arg_idx);
  if (dVar2 == 0) {
    duk_get_type(ctx,arg_idx);
    fmt = "Argument %d: expected native object, got %s";
    line = 0x3c;
  }
  else {
    duk_get_prop_string(ctx,arg_idx,anon_var_dwarf_de5b);
    dVar2 = duk_is_pointer(ctx,-1);
    if (dVar2 == 0) {
      fmt = "Argument %d: expected native object (missing type_info)";
      line = 0x41;
    }
    else {
      this = (TypeInfo *)duk_get_pointer(ctx,-1);
      bVar1 = detail::TypeInfo::can_cast<Shape>(this);
      if (bVar1) {
        duk_pop(ctx);
        duk_get_prop_string(ctx,arg_idx,anon_var_dwarf_c2e7);
        dVar2 = duk_is_pointer(ctx,-1);
        if (dVar2 != 0) {
          pSVar3 = (Shape *)duk_get_pointer(ctx,-1);
          duk_pop(ctx);
          return pSVar3;
        }
        fmt = "Argument %d: invalid native object.";
        line = 0x4c;
      }
      else {
        fmt = "Argument %d: wrong type of native object";
        line = 0x46;
      }
    }
  }
  duk_error_raw(ctx,-6,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_types.h"
                ,line,fmt,arg_idx);
}

Assistant:

static T* read(duk_context* ctx, duk_idx_t arg_idx) {
				using namespace dukglue::detail;

				if (duk_is_null(ctx, arg_idx))
					return nullptr;

				if (!duk_is_object(ctx, arg_idx)) {
					duk_int_t type_idx = duk_get_type(ctx, arg_idx);
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: expected native object, got %s", arg_idx, get_type_name(type_idx));
				}

				duk_get_prop_string(ctx, arg_idx, "\xFF" "type_info");
				if (!duk_is_pointer(ctx, -1))  // missing type_info, must not be a native object
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: expected native object (missing type_info)", arg_idx);

				// make sure this object can be safely returned as a T*
				TypeInfo* info = static_cast<TypeInfo*>(duk_get_pointer(ctx, -1));
				if (!info->can_cast<T>())
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: wrong type of native object", arg_idx);

				duk_pop(ctx);  // pop type_info

				duk_get_prop_string(ctx, arg_idx, "\xFF" "obj_ptr");
				if (!duk_is_pointer(ctx, -1))
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: invalid native object.", arg_idx);

				T* obj = static_cast<T*>(duk_get_pointer(ctx, -1));

				duk_pop(ctx);  // pop obj_ptr

				return obj;
			}